

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void interpreter(str *program,str *input,ostream *out,ostream *err)

{
  bool bVar1;
  s_i raw;
  bool bVar2;
  ostream *this;
  pointer pDVar3;
  byte bVar4;
  encoding_t eVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined4 extraout_var;
  cg_box *pcVar10;
  bool bVar11;
  bool empty;
  vector<Direction,_std::allocator<Direction>_> dirs;
  parse_exc e;
  s_i body;
  bool local_1d5;
  encoding_t local_1d4;
  undefined8 local_1d0;
  undefined8 local_1c8;
  ulong local_1c0;
  ostream *local_1b8;
  int local_1ac;
  undefined8 local_1a8;
  P_Sequence *local_1a0;
  str *local_198;
  ostream *local_190;
  vector<Direction,_std::allocator<Direction>_> local_188;
  undefined1 local_170 [16];
  int *local_160;
  point local_148;
  point pStack_140;
  int local_138;
  vector<int,_std::allocator<int>_> local_130;
  cg_box *local_118;
  cg_box *pcStack_110;
  pointer pDStack_108;
  point local_f0;
  point pStack_e8;
  int local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  str *local_b8;
  undefined1 uStack_b0;
  undefined7 uStack_af;
  char *local_a8;
  State local_a0;
  s_i local_48;
  
  local_1b8 = err;
  local_190 = out;
  eVar5 = detect_encoding(program);
  local_1c8 = 0;
  uVar9 = std::__cxx11::string::find((char)program,10);
  local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170._0_4_ = 1;
  local_170._4_4_ = 0;
  std::vector<Direction,_std::allocator<Direction>_>::emplace_back<point>
            (&local_188,(point *)local_170);
  local_1d4 = eVar5;
  if (uVar9 != 0xffffffffffffffff) {
    local_170[8] = eVar5 == ENC_UTF8;
    local_160 = (int *)(program->_M_dataplus)._M_p;
    local_170._0_8_ = program;
    if (uVar9 != 0) {
      iVar8 = -0x80000000;
      local_1a0 = (P_Sequence *)CONCAT44(local_1a0._4_4_,1);
      local_1c0 = 0;
      local_1c8 = 0;
      local_1a8 = 0;
      local_1d0 = 0;
      local_198 = input;
      do {
        iVar6 = s_i::get((s_i *)local_170);
        if (iVar6 < 0x4d) {
          if (iVar6 - 0x3fU < 8) {
            switch(iVar6) {
            case 0x3f:
              local_1c8 = 1;
              break;
            default:
switchD_001079dc_caseD_40:
              bVar11 = is_dir_inst(iVar6,false);
              if (bVar11) {
                local_160 = (int *)((long)local_160 + -1);
                read_dirs((vector<Direction,_std::allocator<Direction>_> *)&local_118,
                          (s_i *)local_170,false);
                pDVar3 = local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl
                         .super__Vector_impl_data._M_start;
                local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_118;
                local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)pcStack_110;
                local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pDStack_108;
                local_118 = (cg_box *)0x0;
                pcStack_110 = (cg_box *)0x0;
                pDStack_108 = (pointer)0x0;
                if ((cg_box *)pDVar3 != (cg_box *)0x0) {
                  operator_delete(pDVar3);
                }
                if (local_118 != (cg_box *)0x0) {
                  operator_delete(local_118);
                }
              }
              else {
                iVar7 = isspace(iVar6);
                this = local_1b8;
                if (iVar7 == 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1b8,"Unrecognized option: ",0x15);
                  std::ostream::operator<<(this,iVar6);
                  goto LAB_00107f1d;
                }
              }
              break;
            case 0x41:
              local_1d0 = CONCAT71((int7)((ulong)((long)&switchD_001079dc::switchdataD_0010e080 +
                                                 (long)(int)(&switchD_001079dc::switchdataD_0010e080
                                                            )[iVar6 - 0x3fU]) >> 8),1);
              break;
            case 0x45:
              iVar8 = s_i::get((s_i *)local_170);
              break;
            case 0x46:
              iVar8 = 0x20;
            }
          }
          else if (iVar6 == 0x26) {
            local_1c8 = 2;
          }
          else {
            if ((iVar6 != 0x2c) || (iVar7 = s_i::peek((s_i *)local_170,0), iVar7 != 0x2c))
            goto switchD_001079dc_caseD_40;
            skip_comment((s_i *)local_170);
          }
        }
        else if (iVar6 == 0x4d) {
          local_1a8 = CONCAT71((int7)(CONCAT44(extraout_var,iVar6) >> 8),1);
        }
        else if (iVar6 == 0x52) {
          local_1c0 = 1;
        }
        else {
          if (iVar6 != 0x5e) goto switchD_001079dc_caseD_40;
          local_1a0 = (P_Sequence *)((ulong)local_1a0 & 0xffffffff00000000);
        }
      } while ((ulong)((long)local_160 - *(long *)local_170._0_8_) < uVar9);
      bVar11 = (int)local_1a0 == 1;
      input = local_198;
      goto LAB_00107baf;
    }
    local_1c8 = 0;
  }
  local_1a8 = 0;
  local_1d0 = 0;
  iVar8 = -0x80000000;
  bVar11 = true;
  local_1c0 = 0;
LAB_00107baf:
  eVar5 = local_1d4;
  local_48.utf8 = local_1d4 == ENC_UTF8;
  local_48.i = (program->_M_dataplus)._M_p + uVar9 + 1;
  local_48.s = program;
  local_1a0 = parse(&local_48);
  if (eVar5 == ENC_SINGLE_BYTE) {
    uStack_b0 = false;
  }
  else {
    eVar5 = detect_encoding(input);
    uStack_b0 = eVar5 != ENC_SINGLE_BYTE;
  }
  local_a8 = (input->_M_dataplus)._M_p;
  raw._9_7_ = uStack_af;
  raw.utf8 = (bool)uStack_b0;
  raw.s = input;
  raw.i = local_a8;
  local_b8 = input;
  Grid::Grid((Grid *)&local_118,raw,10,(int)local_1c0,iVar8,&local_1d5);
  State::State((State *)local_170,(Grid *)&local_118,(bool)((byte)local_1a8 & 1));
  Grid::~Grid((Grid *)&local_118);
  if (((int)local_1c8 == 2 & local_1d5) == 1) {
    std::ostream::operator<<(local_190,1);
  }
  else {
    local_1ac = 1;
    local_1d4 = ENC_UTF8;
    if (bVar11) {
      local_1d4 = Grid::bWidth((Grid *)local_170);
      local_1ac = Grid::bHeight((Grid *)local_170);
    }
    bVar11 = 0 < local_1ac;
    if (local_1ac < 1) {
      local_1d0 = (ulong)local_1d0._4_4_ << 0x20;
    }
    else {
      bVar1 = 0 < (int)local_1d4;
      local_1c0 = local_1c0 & 0xffffffff00000000;
      local_1a8 = CONCAT44(local_1a8._4_4_,(uint)(byte)local_1d0) & 0xffffffff00000001;
      local_1d0 = (ulong)local_1d0._4_4_ << 0x20;
      do {
        bVar4 = bVar1;
        if (0 < (int)local_1d4) {
          eVar5 = ENC_ASCII;
          do {
            pDVar3 = local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            local_198 = (str *)CONCAT71(local_198._1_7_,bVar4);
            for (pcVar10 = (cg_box *)
                           local_188.super__Vector_base<Direction,_std::allocator<Direction>_>.
                           _M_impl.super__Vector_impl_data._M_start; pcVar10 != (cg_box *)pDVar3;
                pcVar10 = (cg_box *)((long)&pcVar10->data + 4)) {
              Grid::Grid((Grid *)&local_118,(Grid *)local_170);
              local_e0 = local_138;
              local_f0 = local_148;
              pStack_e8 = pStack_140;
              std::vector<int,_std::allocator<int>_>::vector(&local_d8,&local_130);
              local_f0.x = pcVar10->h;
              local_f0.y = *(int *)&pcVar10->data;
              pStack_e8.y = (int)local_1c0;
              pStack_e8.x = eVar5;
              Grid::Grid(&local_a0.cg,(Grid *)&local_118);
              local_a0.flags = local_e0;
              local_a0.direction = local_f0;
              local_a0.position = pStack_e8;
              std::vector<int,_std::allocator<int>_>::vector(&local_a0.qcount,&local_d8);
              iVar8 = match(&local_a0,local_1a0,SUB81(local_1a8,0));
              if (local_a0.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_a0.qcount.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              Grid::~Grid(&local_a0.cg);
              if (iVar8 < 1) {
                if (iVar8 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1b8,"Stack Overflow\n",0xf);
                  goto LAB_00107e63;
                }
                bVar2 = true;
                iVar6 = 0;
                if ((int)local_1c8 == 2) goto LAB_00107e41;
              }
              else {
                iVar6 = 1;
                if ((int)local_1c8 == 1) {
LAB_00107e41:
                  std::ostream::operator<<(local_190,iVar6);
LAB_00107e63:
                  bVar2 = false;
                }
                else {
                  local_1d0 = CONCAT44(local_1d0._4_4_,(int)local_1d0 + iVar8);
                  bVar2 = true;
                }
              }
              if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              Grid::~Grid((Grid *)&local_118);
              if (!bVar2) break;
            }
            if (pcVar10 != (cg_box *)pDVar3) {
              bVar4 = (byte)local_198;
              break;
            }
            eVar5 = eVar5 + ENC_UTF8;
            bVar4 = (int)eVar5 < (int)local_1d4;
          } while (eVar5 != local_1d4);
        }
        if ((bVar4 & 1) != 0) break;
        iVar8 = (int)local_1c0 + 1;
        local_1c0 = CONCAT44(local_1c0._4_4_,iVar8);
        bVar11 = iVar8 < local_1ac;
      } while (iVar8 != local_1ac);
    }
    if (!bVar11) {
      iVar8 = (int)local_1d0;
      if ((int)local_1c8 == 2) {
        iVar8 = 1;
      }
      std::ostream::operator<<(local_190,iVar8);
    }
  }
  if (local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid((Grid *)local_170);
LAB_00107f1d:
  if ((cg_box *)
      local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
      super__Vector_impl_data._M_start != (cg_box *)0x0) {
    operator_delete(local_188.super__Vector_base<Direction,_std::allocator<Direction>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void interpreter(const str &program, const str &input, std::ostream &out, std::ostream &err) {
    encoding_t progEnc = detect_encoding(program);
    size_t nl = program.find('\n');
    m_just just = M_JUST_LEFT; m_start start = M_START_ALLBOX; m_type type = M_TYPE_COUNT;
    int chfill = OUT_CHAR;
    bool mobile = false, allpaths = false;
    vector<Direction> dirs;
    dirs.emplace_back( point{ 1, 0 } );

    if (~nl) {
        s_i o{ program, progEnc == ENC_UTF8 };
        for (int c; o.ind() < nl; ) {
            c = o.get();
            if (c == INST_OPTION_TYPE_BOOLEAN) type = M_TYPE_BOOLEAN;
            else if (c == INST_OPTION_TYPE_ALL) type = M_TYPE_ALL;
            else if (c == INST_OPTION_RJUST) just = M_JUST_RIGHT;
            else if (c == INST_OPTION_START_TOPLEFT) start = M_START_TOPLEFT;
            else if (c == INST_OPTION_FILL_SPACE) chfill = ' ';
            else if (c == INST_OPTION_FILL_CHAR) chfill = o.get();
            else if (c == INST_OPTION_MOBILE_START) mobile = true;
            else if (c == INST_OPTION_ALL_PATHS) allpaths = true;
            else if (c == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT && o.peek() == INST_QUANTIFIER_RANGE_OR_LINE_COMMENT) skip_comment(o);
            else if (is_dir_inst(c, false)) {
                o.back();
                dirs = read_dirs(o, false);
            } else if (!isspace(c)) {
                err << "Unrecognized option: " << c;
                return;
            }
        }
    }

    s_i body{ program, progEnc == ENC_UTF8, nl + 1 };
    P_Sequence *pat;
    try {
        pat = parse(body);
    } catch (parse_exc e) {
        err << "Parse error: " << e.what();
        if (~e.i) err << " at position " << e.i;
        err << std::endl;
        return;
    }
    bool empty;
    State global(Grid{ s_i{ input, progEnc != ENC_SINGLE_BYTE && detect_encoding(input) != ENC_SINGLE_BYTE },
        '\n', just, chfill, empty }, mobile);
    if (empty && type == M_TYPE_ALL) {
        out << 1;
        return;
    }

    int nmatch = 0;

    int xmax = start == M_START_ALLBOX ? global.cg.bWidth() : 1;
    int ymax = start == M_START_ALLBOX ? global.cg.bHeight() : 1;
    for (int y = 0; y < ymax; y++) {
        for (int x = 0; x < xmax; x++) {
            for (Direction &d : dirs) {
                State local{ global };
                local.direction = d.absdir();
                local.position = { x, y };
                int mr = match(local, pat, allpaths);
                if (mr > 0) {
                    if (type == M_TYPE_BOOLEAN) {
                        out << 1;
                        return;
                    }
                    nmatch += mr;
                } else if (mr == MATCH_RESULT_OVERFLOW) {
                    err << "Stack Overflow\n";
                    return;
                } else if (type == M_TYPE_ALL) {
                    out << 0;
                    return;
                }
            }
        }
    }
    if (type == M_TYPE_ALL) {
        out << 1;
    } else {
        out << nmatch;
    }
}